

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  pointer pBVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  iterator __position;
  iterator __position_00;
  pointer pBVar13;
  pointer pBVar14;
  Mat *this_02;
  undefined1 auVar15 [16];
  int *piVar16;
  byte bVar17;
  uint uVar18;
  float *pfVar19;
  ulong uVar20;
  long lVar21;
  pointer pfVar22;
  BBoxRect *__args;
  pointer pMVar23;
  float *pfVar24;
  float *pfVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  float *pfVar30;
  float *pfVar31;
  pointer pvVar32;
  bool bVar33;
  bool bVar34;
  float fVar35;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar37;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<int,_std::allocator<int>_> softmax_rets;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_228;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_208;
  ulong local_1f0;
  YoloDetectionOutput *local_1e8;
  float local_1dc;
  vector<float,_std::allocator<float>_> local_1d8;
  int local_1c0;
  Allocator *local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  int local_1a0;
  ulong local_198;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_188;
  ulong local_170;
  vector<float,_std::allocator<float>_> local_168;
  uint local_14c;
  vector<int,_std::allocator<int>_> local_148;
  float local_128;
  uint uStack_124;
  undefined8 uStack_120;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_110;
  Option *local_108;
  long local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float fStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  BBoxRect local_c8;
  ulong local_a8;
  long local_a0;
  pointer local_98;
  ulong local_90;
  ulong local_88;
  float *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pMVar23 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar34 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish == pMVar23;
  bVar33 = !bVar34;
  local_110 = bottom_top_blobs;
  local_108 = opt;
  if (bVar34) {
    local_1f0 = 0;
  }
  else {
    local_1f0 = 0;
    uVar28 = 0;
    local_1e8 = this;
    do {
      iVar29 = pMVar23[uVar28].c / this->num_box;
      if (iVar29 == this->num_class + 5) {
        uVar5 = pMVar23[uVar28].w;
        uVar7 = pMVar23[uVar28].h;
        uStack_120 = 0;
        local_208.
        super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.
        super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.
        super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_228.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_228.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_228.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128 = (float)uVar5;
        uStack_124 = uVar7;
        local_a8 = uVar28;
        std::
        vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ::resize(&local_208,(long)this->num_box);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize(&local_228,(long)this->num_box);
        local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize(&local_148,(long)this->num_box);
        if (0 < this->num_box) {
          local_98 = pMVar23 + uVar28;
          auVar36._4_4_ = -(uint)(0 < (int)local_128);
          auVar36._0_4_ = -(uint)(0 < (int)local_128);
          auVar36._8_4_ = -(uint)(0 < (int)uStack_124);
          auVar36._12_4_ = -(uint)(0 < (int)uStack_124);
          local_14c = movmskpd((int)local_98,auVar36);
          bVar17 = (byte)local_14c;
          local_a0 = (long)iVar29;
          local_90 = (ulong)uStack_124;
          local_88 = (ulong)(uint)local_128;
          auVar15._4_4_ = (float)(int)uStack_124;
          auVar15._0_4_ = (float)(int)local_128;
          auVar15._8_4_ = (float)(int)uStack_120;
          auVar15._12_4_ = (float)(int)((ulong)uStack_120 >> 0x20);
          local_78 = divps(_DAT_005fcbe0,auVar15);
          lVar27 = 0;
          do {
            lVar21 = lVar27 * local_a0;
            local_f8 = *(undefined8 *)((long)(this->biases).data + lVar27 * 8);
            uStack_f0 = 0;
            pvVar10 = local_98->data;
            sVar11 = local_98->elemsize;
            sVar12 = local_98->cstep;
            local_1a0 = this->num_class;
            uStack_1a8._0_4_ = local_98->h;
            uStack_1a8._4_4_ = local_98->d;
            local_198 = local_98->elemsize;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((lVar21 + 5) * local_98->cstep * local_198 + (long)local_98->data);
            local_1c0 = local_98->elempack;
            local_1b8 = local_98->allocator;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = 0;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = 0;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)local_198;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(local_198 >> 0x20);
            local_198 = ((long)local_98->d * local_198 * (long)local_98->h * (long)local_98->w + 0xf
                        & 0xfffffffffffffff0) / local_198;
            local_1b0._0_4_ = local_98->dims;
            local_1b0._4_4_ = local_98->w;
            uVar18 = (*this->softmax->_vptr_Layer[9])(this->softmax,&local_1d8,local_108);
            local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar27] = uVar18;
            local_100 = lVar27;
            if (bVar17 >> 1 != 0) {
              lVar27 = sVar12 * sVar11;
              pfVar19 = (float *)(lVar27 * lVar21 + (long)pvVar10);
              pfVar31 = (float *)((lVar21 + 1) * lVar27 + (long)pvVar10);
              pfVar30 = (float *)((lVar21 + 2) * lVar27 + (long)pvVar10);
              pfVar24 = (float *)((lVar21 + 3) * lVar27 + (long)pvVar10);
              pfVar25 = (float *)((lVar21 + 4) * lVar27 + (long)pvVar10);
              local_f8 = CONCAT44(local_f8._4_4_ * 0.5,(float)local_f8 * 0.5);
              uStack_f0 = CONCAT44(uStack_f0._4_4_ * 0.0,(float)uStack_f0 * 0.0);
              local_170 = 0;
              do {
                if ((local_14c & 1) != 0) {
                  local_68 = ZEXT416((uint)(float)(int)local_170);
                  lVar27 = 0;
                  uVar28 = 0;
                  do {
                    local_128 = *pfVar30;
                    local_d8 = *pfVar24;
                    local_e8 = -*pfVar19;
                    fStack_e4 = -*pfVar31;
                    uStack_e0 = 0x80000000;
                    uStack_dc = 0x80000000;
                    local_80 = pfVar19;
                    local_48 = expf(local_e8);
                    fStack_44 = extraout_XMM0_Db;
                    local_58 = expf(fStack_e4);
                    fStack_54 = extraout_XMM0_Db_00;
                    local_e8 = expf(local_d8);
                    local_d8 = expf(local_128);
                    local_128 = SUB84(pfVar25,0);
                    uStack_124 = (uint)((ulong)pfVar25 >> 0x20);
                    fVar35 = expf(-*pfVar25);
                    lVar21 = local_100;
                    if ((long)local_1e8->num_class < 1) {
                      iVar29 = 0;
                      local_1dc = 0.0;
                    }
                    else {
                      pfVar19 = (float *)(local_170 *
                                          CONCAT44(local_1d8.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage._4_4_,
                                                   local_1d8.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage._0_4_) * (long)local_1b0._4_4_
                                          + lVar27 +
                                         (long)local_1d8.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start);
                      local_1dc = 0.0;
                      uVar26 = 0;
                      uVar20 = 0;
                      do {
                        if (local_1dc < *pfVar19) {
                          uVar20 = uVar26 & 0xffffffff;
                          local_1dc = *pfVar19;
                        }
                        iVar29 = (int)uVar20;
                        uVar26 = uVar26 + 1;
                        pfVar19 = (float *)((long)pfVar19 +
                                           CONCAT44(local_1d8.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_,local_1d8.
                                                                                                                
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_) * local_198);
                      } while ((long)local_1e8->num_class != uVar26);
                    }
                    local_1dc = local_1dc / (fVar35 + 1.0);
                    if (local_1e8->confidence_threshold <= local_1dc) {
                      auVar38._0_4_ = local_48 + (float)DAT_005fcbe0;
                      auVar38._4_4_ = local_58 + DAT_005fcbe0._4_4_;
                      auVar38._8_4_ = fStack_44 + DAT_005fcbe0._8_4_;
                      auVar38._12_4_ = fStack_54 + DAT_005fcbe0._12_4_;
                      auVar36 = divps(_DAT_005fcbe0,auVar38);
                      fVar35 = (auVar36._0_4_ + (float)(int)uVar28) * (float)local_78._0_4_;
                      fVar37 = (auVar36._4_4_ + (float)local_68._0_4_) * (float)local_78._4_4_;
                      local_c8.xmax = local_d8 * (float)local_f8 * (float)local_78._0_4_;
                      local_c8.ymax = local_e8 * local_f8._4_4_ * (float)local_78._4_4_;
                      local_c8.xmin = fVar35 - local_c8.xmax;
                      local_c8.ymin = fVar37 - local_c8.ymax;
                      local_c8.xmax = local_c8.xmax + fVar35;
                      local_c8.ymax = local_c8.ymax + fVar37;
                      this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                                (local_208.
                                 super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_100);
                      __position._M_current = *(BBoxRect **)(this_00 + 8);
                      local_c8.label = iVar29;
                      if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                        _M_realloc_insert<ncnn::BBoxRect_const&>(this_00,__position,&local_c8);
                      }
                      else {
                        (__position._M_current)->label = iVar29;
                        (__position._M_current)->xmin = local_c8.xmin;
                        (__position._M_current)->ymin = local_c8.ymin;
                        (__position._M_current)->xmax = local_c8.xmax;
                        (__position._M_current)->ymax = local_c8.ymax;
                        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
                      }
                      this_01 = (vector<float,std::allocator<float>> *)
                                (local_228.
                                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar21);
                      __position_00._M_current = *(float **)(this_01 + 8);
                      if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
                        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                  (this_01,__position_00,&local_1dc);
                      }
                      else {
                        *__position_00._M_current = local_1dc;
                        *(float **)(this_01 + 8) = __position_00._M_current + 1;
                      }
                    }
                    pfVar19 = local_80 + 1;
                    pfVar31 = pfVar31 + 1;
                    pfVar30 = pfVar30 + 1;
                    pfVar24 = pfVar24 + 1;
                    pfVar25 = (float *)(CONCAT44(uStack_124,local_128) + 4);
                    uVar28 = uVar28 + 1;
                    lVar27 = lVar27 + 4;
                  } while (uVar28 != local_88);
                }
                local_170 = local_170 + 1;
              } while (local_170 != local_90);
            }
            lVar27 = local_100;
            this = local_1e8;
            piVar16 = (int *)CONCAT44(local_1d8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                      local_1d8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (local_1b8 == (Allocator *)0x0) {
                  if (local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_1b8->_vptr_Allocator[3])();
                }
              }
            }
            local_198 = 0;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = 0;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = 0;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            local_1c0 = 0;
            local_1b0 = 0;
            uStack_1a8 = 0;
            local_1a0 = 0;
            lVar27 = lVar27 + 1;
          } while (lVar27 < this->num_box);
        }
        bVar34 = this->num_box < 1;
        if (this->num_box < 1) {
LAB_00476802:
          uVar18 = (uint)local_1f0;
        }
        else {
          uVar18 = *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (uVar18 == 0) {
            lVar27 = 1;
            lVar21 = 2;
            do {
              pvVar32 = local_228.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                        ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_188,
                         local_188.
                         super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
                         .super__Vector_impl_data._M_finish,
                         *(undefined8 *)
                          ((long)local_208.
                                 super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar21 * 4 + -8),
                         *(undefined8 *)
                          ((long)&((local_208.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar21 * 4));
              std::vector<float,std::allocator<float>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                        ((vector<float,std::allocator<float>> *)&local_168,
                         local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         *(undefined8 *)((long)pvVar32 + lVar21 * 4 + -8),
                         *(undefined8 *)
                          ((long)&(pvVar32->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar21 * 4));
              bVar34 = this->num_box <= lVar27;
              if (this->num_box <= lVar27) goto LAB_00476802;
              uVar18 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar27];
              lVar27 = lVar27 + 1;
              lVar21 = lVar21 + 6;
            } while (uVar18 == 0);
          }
        }
        if ((uint *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (uint *)0x0) {
          operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_228);
        std::
        vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ::~vector(&local_208);
        local_1f0 = (ulong)uVar18;
        uVar28 = local_a8;
      }
      else {
        local_1f0 = 0xffffffff;
        bVar34 = false;
      }
      if (!bVar34) break;
      uVar28 = uVar28 + 1;
      pMVar23 = (local_110->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      bVar33 = uVar28 < (ulong)(((long)(local_110->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar23 >>
                                3) * -0x71c71c71c71c71c7);
    } while (bVar33);
  }
  iVar29 = (int)local_1f0;
  if (!bVar33) {
    if ((local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::BBoxRect>
                (&local_188,&local_168,0,
                 (int)((ulong)((long)local_168.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_168.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
    pBVar13 = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pBVar14 = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_208.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8 = (YoloDetectionOutput *)CONCAT44(local_1e8._4_4_,this->nms_threshold);
    pvVar32 = (pointer)(((long)local_188.
                               super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_188.
                               super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333)
    ;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_1d8,(size_type)pvVar32,(allocator_type *)&local_228);
    if (pBVar13 == pBVar14) {
      local_228.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      pfVar19 = &(local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start)->xmax;
      lVar27 = 0;
      do {
        uVar6 = ((BBoxRect *)(pfVar19 + -2))->xmin;
        uVar8 = ((BBoxRect *)(pfVar19 + -2))->ymin;
        local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar27] =
             ((float)((ulong)*(undefined8 *)pfVar19 >> 0x20) - (float)uVar8) *
             ((float)*(undefined8 *)pfVar19 - (float)uVar6);
        lVar27 = lVar27 + 1;
        pfVar19 = pfVar19 + 5;
      } while ((long)&(pvVar32->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start + (ulong)(pvVar32 == (pointer)0x0) != lVar27)
      ;
      local_228.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (pBVar13 != pBVar14) {
        do {
          uVar18 = (uint)((ulong)((long)local_208.
                                        super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_208.
                                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
          if ((int)uVar18 < 1) {
LAB_00476aa6:
            if (local_208.
                super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_208.
                super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_208,
                         (iterator)
                         local_208.
                         super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_228);
            }
            else {
              *(pointer *)
               local_208.
               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish =
                   local_228.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_208.
              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((long)local_208.
                                   super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 8);
            }
          }
          else {
            pBVar14 = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      (long)local_228.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
            fVar35 = pBVar14->xmin;
            bVar33 = true;
            uVar28 = 0;
            do {
              pBVar13 = (&((local_208.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                          _M_impl.super__Vector_impl_data._M_start)[uVar28];
              fVar37 = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pBVar13].xmax;
              fVar40 = 0.0;
              if (fVar35 <= fVar37) {
                pBVar1 = local_188.
                         super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
                         .super__Vector_impl_data._M_start + (long)pBVar13;
                fVar2 = pBVar14->xmax;
                fVar41 = pBVar1->xmin;
                if (fVar41 <= fVar2) {
                  fVar3 = pBVar14->ymin;
                  fVar39 = pBVar1->ymax;
                  if (fVar3 <= fVar39) {
                    fVar4 = pBVar14->ymax;
                    fVar42 = pBVar1->ymin;
                    if (fVar42 <= fVar4) {
                      if (fVar2 <= fVar37) {
                        fVar37 = fVar2;
                      }
                      if (fVar41 <= fVar35) {
                        fVar41 = fVar35;
                      }
                      if (fVar4 <= fVar39) {
                        fVar39 = fVar4;
                      }
                      if (fVar42 <= fVar3) {
                        fVar42 = fVar3;
                      }
                      fVar40 = (fVar39 - fVar42) * (fVar37 - fVar41);
                    }
                  }
                }
              }
              if (local_1e8._0_4_ <
                  fVar40 / ((local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start
                             [(long)local_228.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start] - fVar40) +
                           local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)pBVar13])) {
                bVar33 = false;
              }
              uVar28 = uVar28 + 1;
            } while ((uVar18 & 0x7fffffff) != uVar28);
            if (bVar33) goto LAB_00476aa6;
          }
          local_228.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)&((local_228.
                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data._M_start + 1);
        } while (local_228.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start < pvVar32);
      }
    }
    if (local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT44(local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,
                               local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_4_) -
                      (long)local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar29 = 0;
    local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_228.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_208.
        super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_208.
        super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar28 = 0;
      local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = &((BBoxRect *)0x0)->xmin;
      do {
        pBVar14 = (&((local_208.
                      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)._M_impl.
                    super__Vector_impl_data._M_start)[uVar28];
        __args = local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_start + (long)pBVar14;
        if ((BBoxRect *)
            local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (BBoxRect *)
            CONCAT44(local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_4_)) {
          std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
          _M_realloc_insert<ncnn::BBoxRect_const&>
                    ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1d8,
                     (iterator)
                     local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,__args);
        }
        else {
          ((BBoxRect *)
          local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish)->label = __args->label;
          fVar35 = __args->ymin;
          fVar37 = __args->xmax;
          fVar40 = __args->ymax;
          ((BBoxRect *)
          local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish)->xmin = __args->xmin;
          ((BBoxRect *)
          local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish)->ymin = fVar35;
          ((BBoxRect *)
          local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish)->xmax = fVar37;
          ((BBoxRect *)
          local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish)->ymax = fVar40;
          local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + 0x14);
        }
        if (local_228.
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_228.
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_228,
                     (iterator)
                     local_228.
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)pBVar14);
        }
        else {
          *(float *)local_228.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
               local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pBVar14];
          local_228.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_228.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < (ulong)((long)local_208.
                                      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_208.
                                      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    uVar18 = (int)((long)local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x33333333;
    if (uVar18 != 0) {
      this_02 = (local_110->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar18,4,local_108->blob_allocator);
      iVar29 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar29 = 0, 0 < (int)uVar18)) {
        iVar9 = this_02->w;
        sVar11 = this_02->elemsize;
        pfVar22 = local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4;
        pfVar19 = (float *)((long)this_02->data + 0x14);
        iVar29 = 0;
        uVar28 = 0;
        do {
          fVar35 = *(float *)((long)&((local_228.
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                     super__Vector_impl_data._M_start + uVar28 * 4);
          pfVar19[-5] = (float)(int)*pfVar22 + 1.0;
          pfVar19[-4] = fVar35;
          pfVar19[-3] = pfVar22[-4];
          pfVar19[-2] = pfVar22[-3];
          pfVar19[-1] = pfVar22[-2];
          *pfVar19 = pfVar22[-1];
          uVar28 = uVar28 + 1;
          pfVar22 = pfVar22 + 5;
          pfVar19 = (float *)((long)pfVar19 + (long)iVar9 * sVar11);
        } while ((uVar18 & 0x7fffffff) != uVar28);
      }
    }
    if (local_228.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_228.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT44(local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,
                               local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_4_) -
                      (long)local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_208.
        super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.
                      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar29;
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector<std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        std::vector<int> softmax_rets;
        softmax_rets.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp * 2];
            const float bias_h = biases[pp * 2 + 1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p + 1);
            const float* wptr = bottom_top_blob.channel(p + 2);
            const float* hptr = bottom_top_blob.channel(p + 3);

            const float* box_score_ptr = bottom_top_blob.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p + 5, num_class);
            softmax_rets[pp] = softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = expf(wptr[0]) * bias_w / w;
                    float bbox_h = expf(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //                 NCNN_LOGE("%d %f %f", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = {bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            if (softmax_rets[i] != 0)
                return softmax_rets[i];

            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}